

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderVSGSArrayedVariableSizeMismatchTest::iterate
          (GeometryShaderVSGSArrayedVariableSizeMismatchTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  bool has_shader_compilation_failed;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *vs_code_raw;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  string gs_code_specialized;
  char *gs_code_raw;
  string fs_code_specialized;
  undefined1 local_1a0 [384];
  long lVar5;
  
  has_shader_compilation_failed = true;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    GVar3 = (**(code **)(lVar5 + 0x3c8))();
    this->m_po_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x4df);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x4e6);
    gs_code_raw = 
    "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nin vec4 Color1[];\nin vec4 Color2[2];\nin vec4 Color3[3];\n\nvoid main()\n{\n    gl_Position = Color1[0] + Color2[1] + Color3[2];\n    EmitVertex();\n}\n"
    ;
    vs_code_raw = 
    "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nout vec4 Color1;\nout vec4 Color2;\nout vec4 Color3;\n\nvoid main()\n{\n    Color1 = vec4(gl_VertexID, 0.0,         0.0,         0.0);\n    Color2 = vec4(0.0,         gl_VertexID, 0.0,         0.0);\n    Color3 = vec4(0.0,         0.0,         gl_VertexID, 0.0);\n}\n"
    ;
    TestCaseBase::specializeShader_abi_cxx11_
              (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
    fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
    TestCaseBase::specializeShader_abi_cxx11_
              (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code_raw);
    gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
    TestCaseBase::specializeShader_abi_cxx11_
              (&vs_code_specialized,&this->super_TestCaseBase,1,&vs_code_raw);
    vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                       &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,
                       this->m_fs_id,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
    if (!bVar1) {
      description = "Pass";
    }
    else {
      local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Program object was linked successfully, whereas a failure was expected.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    std::__cxx11::string::~string((string *)&vs_code_specialized);
    std::__cxx11::string::~string((string *)&gs_code_specialized);
    std::__cxx11::string::~string((string *)&fs_code_specialized);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
             ,0x4d7);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderVSGSArrayedVariableSizeMismatchTest::iterate()
{
	bool has_shader_compilation_failed = true;
	bool result						   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a program object */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	const char* gs_code_raw = "${VERSION}\n"
							  "${GEOMETRY_SHADER_REQUIRE}\n"
							  "\n"
							  "layout (points)                   in;\n"
							  "layout (points, max_vertices = 1) out;\n"
							  "\n"
							  "in vec4 Color1[];\n"
							  "in vec4 Color2[2];\n"
							  "in vec4 Color3[3];\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    gl_Position = Color1[0] + Color2[1] + Color3[2];\n"
							  "    EmitVertex();\n"
							  "}\n";

	const char* vs_code_raw = "${VERSION}\n"
							  "${GEOMETRY_SHADER_REQUIRE}\n"
							  "\n"
							  "out vec4 Color1;\n"
							  "out vec4 Color2;\n"
							  "out vec4 Color3;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    Color1 = vec4(gl_VertexID, 0.0,         0.0,         0.0);\n"
							  "    Color2 = vec4(0.0,         gl_VertexID, 0.0,         0.0);\n"
							  "    Color3 = vec4(0.0,         0.0,         gl_VertexID, 0.0);\n"
							  "}\n";

	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();
	std::string gs_code_specialized		= specializeShader(1, &gs_code_raw);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();
	std::string vs_code_specialized		= specializeShader(1, &vs_code_raw);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	if (TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,					 /* n_sh1_body_parts */
								   &gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
								   &vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
								   &fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Program object was linked successfully, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}